

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O0

void __thiscall xmrig::HttpClient::onResolved(HttpClient *this,Dns *dns,int status)

{
  ushort uVar1;
  bool bVar2;
  String *this_00;
  char *pcVar3;
  undefined8 uVar4;
  sockaddr *psVar5;
  long *plVar6;
  int in_EDX;
  Dns *in_RSI;
  Dns *in_RDI;
  uv_connect_t *req;
  sockaddr *addr;
  Dns *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffe0;
  uint16_t port;
  undefined4 in_stack_ffffffffffffffe8;
  Dns *this_01;
  
  port = (uint16_t)((ulong)in_stack_ffffffffffffffe0 >> 0x30);
  (in_RDI->m_hints).ai_protocol = in_EDX;
  this_01 = in_RDI;
  if ((in_EDX < 0) && (bVar2 = Dns::isEmpty(in_stack_ffffffffffffffc0), bVar2)) {
    if (((ulong)in_RDI[1].m_ipv6.
                super__Vector_base<xmrig::DnsRecord,_std::allocator<xmrig::DnsRecord>_>._M_impl.
                super__Vector_impl_data._M_finish & 1) == 0) {
      this_00 = Dns::host(in_RSI);
      pcVar3 = String::data(this_00);
      uVar1 = *(ushort *)&in_RDI[1].m_host.m_data;
      uVar4 = uv_strerror(in_EDX);
      Log::print(ERR,"[%s:%d] DNS error: \"%s\"",pcVar3,(ulong)uVar1,uVar4);
    }
  }
  else {
    Dns::get(this_01,(Type)((ulong)in_RSI >> 0x20));
    psVar5 = DnsRecord::addr((DnsRecord *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),port);
    plVar6 = (long *)operator_new(0x60);
    *plVar6 = (long)in_RDI;
    uv_tcp_connect(plVar6,in_RDI->m_resolver,psVar5,onConnect);
  }
  return;
}

Assistant:

void xmrig::HttpClient::onResolved(const Dns &dns, int status)
{
    this->status = status;

    if (status < 0 && dns.isEmpty()) {
        if (!m_quiet) {
            LOG_ERR("[%s:%d] DNS error: \"%s\"", dns.host().data(), m_port, uv_strerror(status));
        }

        return;
    }

    sockaddr *addr = dns.get().addr(m_port);

    auto req  = new uv_connect_t;
    req->data = this;

    uv_tcp_connect(req, m_tcp, addr, onConnect);
}